

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

void __thiscall CCoinsViewCache::SanityCheck(CCoinsViewCache *this)

{
  CoinsCachePair *pCVar1;
  CoinsCachePair *pCVar2;
  size_t sVar3;
  long lVar4;
  _Hash_node_base *p_Var5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  
  p_Var5 = (this->cacheCoins)._M_h._M_before_begin._M_nxt;
  if (p_Var5 == (_Hash_node_base *)0x0) {
    lVar4 = 0;
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    lVar4 = 0;
    do {
      uVar9 = *(byte *)&p_Var5[8]._M_nxt & 3;
      uVar7 = uVar9 + 4;
      if (p_Var5[9]._M_nxt != (_Hash_node_base *)0xffffffffffffffff) {
        uVar7 = uVar9;
      }
      if ((uVar7 < 8) && ((0x94U >> uVar7 & 1) != 0)) {
        __assert_fail("attr != 2 && attr != 4 && attr != 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                      ,0x149,"void CCoinsViewCache::SanityCheck() const");
      }
      uVar7 = *(uint *)&p_Var5[0xb]._M_nxt;
      if (*(uint *)((long)&p_Var5[0xd]._M_nxt + 4) < 0x1d) {
        uVar7 = 0;
      }
      uVar8 = 0;
      if (uVar7 != 0) {
        uVar8 = (ulong)uVar7 + 0x1f & 0xfffffffffffffff0;
      }
      sVar3 = sVar3 + uVar8;
      lVar4 = (lVar4 + 1) - (ulong)((*(byte *)&p_Var5[8]._M_nxt & 3) == 0);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  lVar6 = 0;
  pCVar2 = (this->m_sentinel).second.m_next;
  while (pCVar2 != &this->m_sentinel) {
    pCVar1 = (pCVar2->second).m_next;
    if ((pCVar1->second).m_prev != pCVar2) {
      __assert_fail("it->second.Next()->second.Prev() == it",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                    ,0x155,"void CCoinsViewCache::SanityCheck() const");
    }
    if ((((pCVar2->second).m_prev)->second).m_next != pCVar2) {
      __assert_fail("it->second.Prev()->second.Next() == it",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                    ,0x156,"void CCoinsViewCache::SanityCheck() const");
    }
    if (((pCVar2->second).m_flags & 3) == 0) {
      __assert_fail("it->second.IsDirty() || it->second.IsFresh()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                    ,0x158,"void CCoinsViewCache::SanityCheck() const");
    }
    lVar6 = lVar6 + 1;
    pCVar2 = pCVar1;
  }
  if (lVar6 != lVar4) {
    __assert_fail("count_linked == count_flagged",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                  ,0x15c,"void CCoinsViewCache::SanityCheck() const");
  }
  if (sVar3 == this->cachedCoinsUsage) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("recomputed_usage == cachedCoinsUsage",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                ,0x15d,"void CCoinsViewCache::SanityCheck() const");
}

Assistant:

void CCoinsViewCache::SanityCheck() const
{
    size_t recomputed_usage = 0;
    size_t count_flagged = 0;
    for (const auto& [_, entry] : cacheCoins) {
        unsigned attr = 0;
        if (entry.IsDirty()) attr |= 1;
        if (entry.IsFresh()) attr |= 2;
        if (entry.coin.IsSpent()) attr |= 4;
        // Only 5 combinations are possible.
        assert(attr != 2 && attr != 4 && attr != 7);

        // Recompute cachedCoinsUsage.
        recomputed_usage += entry.coin.DynamicMemoryUsage();

        // Count the number of entries we expect in the linked list.
        if (entry.IsDirty() || entry.IsFresh()) ++count_flagged;
    }
    // Iterate over the linked list of flagged entries.
    size_t count_linked = 0;
    for (auto it = m_sentinel.second.Next(); it != &m_sentinel; it = it->second.Next()) {
        // Verify linked list integrity.
        assert(it->second.Next()->second.Prev() == it);
        assert(it->second.Prev()->second.Next() == it);
        // Verify they are actually flagged.
        assert(it->second.IsDirty() || it->second.IsFresh());
        // Count the number of entries actually in the list.
        ++count_linked;
    }
    assert(count_linked == count_flagged);
    assert(recomputed_usage == cachedCoinsUsage);
}